

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngTRNGIsAvail(void)

{
  long lVar1;
  bool_t bVar2;
  u32 info [4];
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 local_4;
  
  lVar1 = cpuid_basic_info(0);
  uVar3 = *(undefined4 *)(lVar1 + 4);
  bVar2 = rngCPUIDIsManufId((u32 *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
  if ((bVar2 == 0) &&
     (bVar2 = rngCPUIDIsManufId((u32 *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffd8), bVar2 == 0)) {
    local_4 = 0;
  }
  else {
    lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
    local_4 = (uint)((*(uint *)(lVar1 + 4) & 0x40000) != 0);
  }
  return local_4;
}

Assistant:

static bool_t rngTRNGIsAvail()
{
	u32 info[4];
	// Intel or AMD?
	rngCPUID(info, 0);
	if (!rngCPUIDIsManufId(info, "GenuineIntel") &&
		!rngCPUIDIsManufId(info, "AuthenticAMD"))
		return FALSE;
	// rdseed?
	rngCPUID(info, 7);
	return (info[1] & 0x00040000) != 0;
}